

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O0

void __thiscall
TPZTensor<TFad<6,_double>_>::TPZTensor
          (TPZTensor<TFad<6,_double>_> *this,TPZFMatrix<TFad<6,_double>_> *input)

{
  TFad<6,_double> *this_00;
  TFad<6,_double> *rhs;
  long *in_RSI;
  TPZSavable *in_RDI;
  TFad<6,_double> *in_stack_fffffffffffffdd8;
  TFad<6,_double> *in_stack_fffffffffffffde0;
  undefined1 local_1e8 [56];
  TFad<6,_double> *in_stack_fffffffffffffe50;
  int64_t in_stack_fffffffffffffe58;
  TPZManVector<TFad<6,_double>,_6> *in_stack_fffffffffffffe60;
  undefined1 local_168 [64];
  undefined1 local_128 [64];
  undefined1 local_e8 [64];
  undefined1 local_a8 [80];
  undefined8 local_58;
  long *local_10;
  
  local_10 = in_RSI;
  TPZSavable::TPZSavable(in_RDI,&PTR_PTR_02438e30);
  in_RDI->_vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_02438de0;
  local_58 = 0;
  TFad<6,_double>::TFad(in_stack_fffffffffffffde0,(double *)in_stack_fffffffffffffdd8);
  TPZManVector<TFad<6,_double>,_6>::TPZManVector
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b5fa9);
  (**(code **)(*local_10 + 0x120))(local_a8,local_10,0);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 1),0);
  TFad<6,_double>::operator=(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b6006);
  (**(code **)(*local_10 + 0x120))(local_e8,local_10,0,1);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 1),1);
  TFad<6,_double>::operator=(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b6068);
  (**(code **)(*local_10 + 0x120))(local_128,local_10,0,2);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 1),2);
  TFad<6,_double>::operator=(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b60ca);
  (**(code **)(*local_10 + 0x120))(local_168,local_10,1);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 1),3);
  TFad<6,_double>::operator=(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b612b);
  (**(code **)(*local_10 + 0x120))(&stack0xfffffffffffffe58,local_10,1,2);
  this_00 = TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 1),4);
  TFad<6,_double>::operator=(this_00,in_stack_fffffffffffffdd8);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b618e);
  (**(code **)(*local_10 + 0x120))(local_1e8,local_10,2);
  rhs = TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 1),5);
  TFad<6,_double>::operator=(this_00,rhs);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b61e4);
  return;
}

Assistant:

TPZTensor(const TPZFMatrix<T> &input) : fData(6, 0.) {
#ifdef PZDEBUG
        if (input.Rows() != 3 || input.Cols() != 3) {
            DebugStop();
        }
        T tol;
        ZeroTolerance(tol);
        for (int i = 0; i < 3; i++) {
            for (int j = 0; j < 3; j++) {
                if (fabs(TPZExtractVal::val(input.GetVal(i, j) - input.GetVal(j, i))) > tol) {
                    std::cout << "diff = " << input.GetVal(i, j) - input.GetVal(j, i) << std::endl;
                    DebugStop();
                }
            }
        }
#endif
        fData[_XX_] = input.GetVal(0, 0);
        fData[_XY_] = input.GetVal(0, 1);
        fData[_XZ_] = input.GetVal(0, 2);
        fData[_YY_] = input.GetVal(1, 1);
        fData[_YZ_] = input.GetVal(1, 2);
        fData[_ZZ_] = input.GetVal(2, 2);
    }